

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitCallIndirect(BinaryInstWriter *this,CallIndirect *curr)

{
  U32LEB x;
  U32LEB x_00;
  BufferWithRandomAccess *pBVar1;
  
  x.value = WasmBinaryWriter::getTableIndex(this->parent,(Name)(curr->table).super_IString.str);
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,curr->isReturn * '\x02' + '\x11');
  x_00.value = WasmBinaryWriter::getTypeIndex(this->parent,(HeapType)(curr->heapType).id);
  pBVar1 = BufferWithRandomAccess::operator<<(pBVar1,x_00);
  BufferWithRandomAccess::operator<<(pBVar1,x);
  return;
}

Assistant:

void BinaryInstWriter::visitCallIndirect(CallIndirect* curr) {
  Index tableIdx = parent.getTableIndex(curr->table);
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallIndirect : BinaryConsts::CallIndirect;
  o << op << U32LEB(parent.getTypeIndex(curr->heapType)) << U32LEB(tableIdx);
}